

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app_dummy.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::GetSteeringData
          (Error *__return_storage_ptr__,CommissionerApp *this,ByteArray *aSteeringData,
          JoinerType aJoinerType)

{
  JoinerType aJoinerType_local;
  ByteArray *aSteeringData_local;
  CommissionerApp *this_local;
  
  Error::Error(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::GetSteeringData(ByteArray &aSteeringData, JoinerType aJoinerType) const
{
    UNUSED(aSteeringData);
    UNUSED(aJoinerType);
    return Error{};
}